

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

void __thiscall google::protobuf::internal::ArenaStringPtr::ClearToEmpty(ArenaStringPtr *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)(this->tagged_ptr_).ptr_;
  if (puVar1 != &fixed_address_empty_string_abi_cxx11_) {
    puVar1 = (undefined8 *)((ulong)puVar1 & 0xfffffffffffffffe);
    puVar1[1] = 0;
    *(undefined1 *)*puVar1 = 0;
  }
  return;
}

Assistant:

T* UnsafeGet() const { return static_cast<T*>(ptr_); }